

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::ForEachStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *pSVar2;
  SQUnsignedInteger pos;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  ulong uVar6;
  SQUnsignedInteger SVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  longlong *plVar10;
  long lVar11;
  undefined1 uVar12;
  SQUnsignedInteger SVar13;
  long lVar14;
  SQObject SVar15;
  SQScope __oldscope__;
  SQObject local_88;
  SQObject local_78;
  SQObject local_68;
  SQUnsignedInteger local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar8 = SQLexer::Lex(&this->_lex);
  this->_token = SVar8;
  Expect(this,0x28);
  SVar15 = Expect(this,0x102);
  local_78._unVal = SVar15._unVal;
  local_78._type = SVar15._type;
  if (this->_token == 0x2c) {
    local_68._4_4_ = local_78._4_4_;
    local_68._type = local_78._type;
    local_68._unVal.nInteger = local_78._unVal.nInteger;
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    SVar15 = Expect(this,0x102);
    local_78._unVal = SVar15._unVal;
    local_78._type = SVar15._type;
  }
  else {
    SVar15 = SQFuncState::CreateString(this->_fs,"@INDEX@",-1);
    local_68._unVal = SVar15._unVal;
    local_68._type = SVar15._type;
  }
  Expect(this,0x118);
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar2 = this->_fs;
  (this->_scope).outers = pSVar2->_outers;
  SVar8 = SQFuncState::GetStackSize(pSVar2);
  (this->_scope).stacksize = SVar8;
  Expression(this);
  Expect(this,0x29);
  SVar8 = SQFuncState::TopTarget(this->_fs);
  SVar9 = SQFuncState::PushLocalVariable(this->_fs,&local_68);
  uVar12 = (undefined1)SVar9;
  local_88._5_1_ = uVar12;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  SVar9 = SQFuncState::PushLocalVariable(this->_fs,&local_78);
  local_88._5_1_ = (char)SVar9;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pSVar2 = this->_fs;
  SVar15 = SQFuncState::CreateString(pSVar2,"@ITERATOR@",-1);
  local_88._unVal = SVar15._unVal;
  local_88._type = SVar15._type;
  SVar9 = SQFuncState::PushLocalVariable(pSVar2,&local_88);
  local_88._5_1_ = (char)SVar9;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  local_50 = (this->_fs->_instructions)._size;
  local_88._5_1_ = (char)SVar8;
  local_88._4_1_ = 0x33;
  local_88._type = 0;
  local_88._6_1_ = uVar12;
  local_88._7_1_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pos = (this->_fs->_instructions)._size;
  local_88._4_1_ = 0x34;
  local_88._type = 0;
  local_88._7_1_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pSVar2 = this->_fs;
  SVar3 = (pSVar2->_unresolvedbreaks)._size;
  SVar4 = (pSVar2->_unresolvedcontinues)._size;
  uVar5 = (pSVar2->_breaktargets)._allocated;
  uVar6 = (pSVar2->_breaktargets)._size;
  if (uVar5 <= uVar6) {
    SVar7 = uVar6 * 2;
    SVar13 = 4;
    if (SVar7 != 0) {
      SVar13 = SVar7;
    }
    plVar10 = (longlong *)sq_vm_realloc((pSVar2->_breaktargets)._vals,uVar5 << 3,SVar13 * 8);
    (pSVar2->_breaktargets)._vals = plVar10;
    (pSVar2->_breaktargets)._allocated = SVar13;
  }
  SVar7 = (pSVar2->_breaktargets)._size;
  (pSVar2->_breaktargets)._size = SVar7 + 1;
  (pSVar2->_breaktargets)._vals[SVar7] = 0;
  pSVar2 = this->_fs;
  uVar5 = (pSVar2->_continuetargets)._size;
  uVar6 = (pSVar2->_continuetargets)._allocated;
  if (uVar6 <= uVar5) {
    SVar7 = uVar5 * 2;
    SVar13 = 4;
    if (SVar7 != 0) {
      SVar13 = SVar7;
    }
    plVar10 = (longlong *)sq_vm_realloc((pSVar2->_continuetargets)._vals,uVar6 << 3,SVar13 * 8);
    (pSVar2->_continuetargets)._vals = plVar10;
    (pSVar2->_continuetargets)._allocated = SVar13;
  }
  SVar7 = (pSVar2->_continuetargets)._size;
  (pSVar2->_continuetargets)._size = SVar7 + 1;
  (pSVar2->_continuetargets)._vals[SVar7] = 0;
  Statement(this,true);
  local_88._type = (int)local_50 + ~(uint)(this->_fs->_instructions)._size;
  local_88._4_4_ = 0x1c;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  SQFuncState::SetInstructionParam(this->_fs,pos - 1,1,(this->_fs->_instructions)._size - pos);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,(this->_fs->_instructions)._size - pos);
  pSVar2 = this->_fs;
  lVar14 = (pSVar2->_unresolvedbreaks)._size - SVar3;
  lVar11 = (pSVar2->_unresolvedcontinues)._size - SVar4;
  if (0 < lVar11) {
    ResolveContinues(this,pSVar2,lVar11,pos - 2);
  }
  if (0 < lVar14) {
    ResolveBreaks(this,this->_fs,lVar14);
  }
  pSVar2 = this->_fs;
  pSVar1 = &(pSVar2->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar2->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  SQFuncState::PopTarget(pSVar2);
  lVar11 = this->_fs->_outers;
  SVar8 = SQFuncState::GetStackSize(this->_fs);
  lVar14 = (this->_scope).stacksize;
  if (SVar8 != lVar14) {
    SQFuncState::SetStackSize(this->_fs,lVar14);
    if (lVar11 != this->_fs->_outers) {
      local_88._type = (SQObjectType)(this->_scope).stacksize;
      local_88._4_4_ = 0x3c;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  return;
}

Assistant:

void ForEachStatement()
    {
        SQObject idxname, valname;
        Lex(); Expect(_SC('(')); valname = Expect(TK_IDENTIFIER);
        if(_token == _SC(',')) {
            idxname = valname;
            Lex(); valname = Expect(TK_IDENTIFIER);
        }
        else{
            idxname = _fs->CreateString(_SC("@INDEX@"));
        }
        Expect(TK_IN);

        //save the stack size
        BEGIN_SCOPE();
        //put the table in the stack(evaluate the table expression)
        Expression(); Expect(_SC(')'));
        SQInteger container = _fs->TopTarget();
        //push the index local var
        SQInteger indexpos = _fs->PushLocalVariable(idxname);
        _fs->AddInstruction(_OP_LOADNULLS, indexpos,1);
        //push the value local var
        SQInteger valuepos = _fs->PushLocalVariable(valname);
        _fs->AddInstruction(_OP_LOADNULLS, valuepos,1);
        //push reference index
        SQInteger itrpos = _fs->PushLocalVariable(_fs->CreateString(_SC("@ITERATOR@"))); //use invalid id to make it inaccessible
        _fs->AddInstruction(_OP_LOADNULLS, itrpos,1);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_FOREACH, container, 0, indexpos);
        SQInteger foreachpos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_POSTFOREACH, container, 0, indexpos);
        //generate the statement code
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(foreachpos, 1, _fs->GetCurrentPos() - foreachpos);
        _fs->SetInstructionParam(foreachpos + 1, 1, _fs->GetCurrentPos() - foreachpos);
        END_BREAKBLE_BLOCK(foreachpos - 1);
        //restore the local variable stack(remove index,val and ref idx)
        _fs->PopTarget();
        END_SCOPE();
    }